

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

hd_context * new_context_phase1(hd_alloc_context *alloc)

{
  hd_context *ctx_00;
  hd_error_context *phVar1;
  hd_warn_context *phVar2;
  hd_context *ctx;
  hd_alloc_context *alloc_local;
  
  ctx_00 = (hd_context *)(*alloc->malloc)(alloc->user,0x138);
  if (ctx_00 != (hd_context *)0x0) {
    memset(ctx_00,0,0x138);
    ctx_00->user = (void *)0x0;
    ctx_00->alloc = alloc;
    phVar1 = (hd_error_context *)hd_malloc_no_throw(ctx_00,0xd110);
    ctx_00->error = phVar1;
    if (ctx_00->error != (hd_error_context *)0x0) {
      ctx_00->error->top = (hd_error_stack_slot *)(ctx_00->error[-1].message + 0x3c);
      ctx_00->error->errcode = 0;
      ctx_00->error->message[0] = '\0';
      phVar2 = (hd_warn_context *)hd_malloc_no_throw(ctx_00,0x104);
      ctx_00->warn = phVar2;
      if (ctx_00->warn != (hd_warn_context *)0x0) {
        ctx_00->warn->message[0] = '\0';
        ctx_00->warn->count = 0;
        return ctx_00;
      }
    }
    fprintf(_stderr,"cannot create context (phase 1)\n");
    hd_drop_context(ctx_00);
  }
  return (hd_context *)0x0;
}

Assistant:

static hd_context *
new_context_phase1(const hd_alloc_context *alloc)
{
    hd_context *ctx;

    ctx = alloc->malloc(alloc->user, sizeof(hd_context));
    if (!ctx)
        return NULL;
    memset(ctx, 0, sizeof *ctx);
    ctx->user = NULL;
    ctx->alloc = alloc;

    ctx->error = Memento_label(hd_malloc_no_throw(ctx, sizeof(hd_error_context)), "hd_error_context");
    if (!ctx->error)
        goto cleanup;
    ctx->error->top = ctx->error->stack - 1;
    ctx->error->errcode = HD_ERROR_NONE;
    ctx->error->message[0] = 0;

    ctx->warn = Memento_label(hd_malloc_no_throw(ctx, sizeof(hd_warn_context)), "hd_warn_context");
    if (!ctx->warn)
        goto cleanup;
    ctx->warn->message[0] = 0;
    ctx->warn->count = 0;


    return ctx;

    cleanup:
    fprintf(stderr, "cannot create context (phase 1)\n");
    hd_drop_context(ctx);
    return NULL;
}